

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stq_internal_cached_slow_sparc64
               (uc_struct_conflict9 *uc,MemoryRegionCache *cache,hwaddr addr,uint64_t val,
               MemTxAttrs attrs,MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  uint64_t *puVar2;
  hwaddr addr1;
  hwaddr l;
  
  l = 8;
  mr = address_space_translate_cached(cache,addr,&addr1,&l,true,attrs);
  if (((l < 8) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_sparc64
                      (uc,mr,addr1,val,(uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_64,attrs);
  }
  else {
    puVar2 = (uint64_t *)qemu_map_ram_ptr_sparc64((uc_struct_conflict9 *)mr->uc,mr->ram_block,addr1)
    ;
    if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
      val = val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
            (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
            (val & 0xff00) << 0x28 | val << 0x38;
    }
    *puVar2 = val;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

static void glue(address_space_stq_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint64_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 8;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 8 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_64 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stq_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stq_be_p(ptr, val);
            break;
        default:
            stq_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 8);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}